

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

bool __thiscall crnlib::dxt_image::flip_y(dxt_image *this)

{
  element_type eVar1;
  bool bVar2;
  uint uVar3;
  uint y;
  uint y_00;
  uint h;
  uint uVar4;
  uint e;
  ulong uVar5;
  element tmp;
  
  if (((uint)(this->m_format + ~cDXN_YX) < 5) ||
     (uVar4 = this->m_height, 4 < uVar4 && (uVar4 & 3) != 0)) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (uVar4 != 1) {
      uVar4 = this->m_blocks_y >> 1;
      for (y_00 = 0; uVar4 != y_00; y_00 = y_00 + 1) {
        flip_row(this,y_00);
      }
      if ((this->m_blocks_y & 1) != 0) {
        h = this->m_height;
        if (3 < h) {
          h = 4;
        }
        for (uVar3 = 0; uVar3 < this->m_blocks_x; uVar3 = uVar3 + 1) {
          for (uVar5 = 0; uVar5 < this->m_num_elements_per_block; uVar5 = uVar5 + 1) {
            tmp.m_bytes = *&this->m_pElements
                            [(this->m_blocks_x * uVar4 + uVar3) * this->m_num_elements_per_block +
                             (int)uVar5].m_bytes;
            eVar1 = this->m_element_type[uVar5];
            if (eVar1 == cAlphaDXT5) {
              dxt5_block::flip_y((dxt5_block *)&tmp,4,h);
            }
            else if (eVar1 == cAlphaDXT3) {
              dxt3_block::flip_y((dxt3_block *)&tmp,4,h);
            }
            else if (eVar1 == cColorDXT1) {
              dxt1_block::flip_y((dxt1_block *)&tmp,4,h);
            }
            *&this->m_pElements
              [(this->m_blocks_x * uVar4 + uVar3) * this->m_num_elements_per_block + (int)uVar5].
              m_bytes = tmp.m_bytes;
          }
        }
        bVar2 = true;
      }
    }
  }
  return bVar2;
}

Assistant:

bool dxt_image::flip_y()
    {
        if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS)
        {
            // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
            return false;
        }

        if ((m_height & 3) && (m_height > 4))
        {
            return false;
        }

        if (m_height == 1)
        {
            return true;
        }

        const uint mid_y = m_blocks_y / 2;

        for (uint y = 0; y < mid_y; y++)
        {
            flip_row(y);
        }

        if (m_blocks_y & 1)
        {
            const uint h = math::minimum(m_height, 4U);
            for (uint x = 0; x < m_blocks_x; x++)
            {
                for (uint e = 0; e < get_elements_per_block(); e++)
                {
                    element tmp(get_element(x, mid_y, e));
                    switch (get_element_type(e))
                    {
                    case cColorDXT1:
                        reinterpret_cast<dxt1_block*>(&tmp)->flip_y(4, h);
                        break;
                    case cAlphaDXT3:
                        reinterpret_cast<dxt3_block*>(&tmp)->flip_y(4, h);
                        break;
                    case cAlphaDXT5:
                        reinterpret_cast<dxt5_block*>(&tmp)->flip_y(4, h);
                        break;
                    default:
                        CRNLIB_ASSERT(0);
                        break;
                    }
                    get_element(x, mid_y, e) = tmp;
                }
            }
        }

        return true;
    }